

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O1

Id dxil_spv::make_fp8_type(Impl *impl)

{
  Id IVar1;
  Builder *pBVar2;
  Capability local_c;
  
  pBVar2 = Converter::Impl::builder(impl);
  local_c = CapabilityInt8;
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&pBVar2->capabilities,&local_c);
  pBVar2 = Converter::Impl::builder(impl);
  IVar1 = spv::Builder::makeIntegerType(pBVar2,8,false);
  return IVar1;
}

Assistant:

static spv::Id make_fp8_type(Converter::Impl &impl)
{
#if WMMA_FP8
	// Doesn't exist in SPIR-V yet. But if a driver magically understands it ... *shrug*
	return impl.builder().makeFloatType(8);
#else
	impl.builder().addCapability(spv::CapabilityInt8);
	return impl.builder().makeUintType(8);
#endif
}